

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void __thiscall
flow_cutter::DistanceAwareCutter::
init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>
          (DistanceAwareCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,DistanceType dist_type,
          SourceTargetPair p,int max_flow_intensity,int random_seed)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)random_seed;
  BasicCutter::
  init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>
            (&this->cutter,graph,tmp,search_algo,p,max_flow_intensity);
  (this->rng)._M_x[0] = uVar2;
  lVar1 = 0x28;
  do {
    uVar2 = (ulong)(((int)lVar1 + ((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965) - 0x27);
    *(ulong *)(&(this->cutter).assimilated[0].node_set.node_count_inside_ + lVar1 * 2) = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x297);
  (this->rng)._M_p = 0x270;
  if (dist_type == hop_distance) {
    compute_hop_distance_from<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
              (graph,tmp,p.source,this->node_dist);
    compute_hop_distance_from<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
              (graph,tmp,p.target,this->node_dist + 1);
    return;
  }
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo, DistanceType dist_type,
        SourceTargetPair p, int max_flow_intensity, int random_seed)
    {
        cutter.init(graph, tmp, search_algo, p, max_flow_intensity);

        rng.seed(random_seed);

        switch (dist_type) {
        case DistanceType::hop_distance:
            compute_hop_distance_from(graph, tmp, p.source, node_dist[source_side]);
            compute_hop_distance_from(graph, tmp, p.target, node_dist[target_side]);
            break;
        case DistanceType::no_distance:
            break;
        default:
            assert(false);
            break;
        }
    }